

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O3

PaHostApiIndex Pa_GetDefaultHostApi(void)

{
  int iVar1;
  
  if (initializationCount_ != 0) {
    iVar1 = -0x2702;
    if (defaultHostApiIndex_ < hostApisCount_) {
      iVar1 = defaultHostApiIndex_;
    }
    if (defaultHostApiIndex_ < 0) {
      iVar1 = -0x2702;
    }
    return iVar1;
  }
  return -10000;
}

Assistant:

PaHostApiIndex Pa_GetDefaultHostApi( void )
{
    int result;

    PA_LOGAPI_ENTER( "Pa_GetDefaultHostApi" );

    if( !PA_IS_INITIALISED_ )
    {
        result = paNotInitialized;
    }
    else
    {
        result = defaultHostApiIndex_;

        /* internal consistency check: make sure that the default host api
         index is within range */

        if( result < 0 || result >= hostApisCount_ )
        {
            result = paInternalError;
        }
    }

    PA_LOGAPI_EXIT_PAERROR_OR_T_RESULT( "Pa_GetDefaultHostApi", "PaHostApiIndex: %d", result );

    return result;
}